

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Money *m)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  string asStack_48 [32];
  
  lVar1 = m->cents;
  pcVar3 = "";
  if (lVar1 < 0) {
    pcVar3 = "-";
  }
  poVar2 = std::operator<<(os,pcVar3);
  std::__cxx11::string::string(asStack_48,(string *)m);
  std::operator<<(poVar2,asStack_48);
  std::ostream::_M_insert<double>((double)lVar1 / *(double *)(&DAT_001040a0 + (lVar1 >> 0x3f) * -8))
  ;
  std::__cxx11::string::~string(asStack_48);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Money& m)
{
	long c = m.get_cents();
	os << (c < 0 ? "-" : "")
		<< m.get_currency()
		<< (c < 0 ? c / (-100.0) : c / 100.0);
	return os;
}